

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O0

LineStream * __thiscall deqp::gls::LineStream::operator<<(LineStream *this,char *line)

{
  ostream *poVar1;
  int local_1c;
  int i;
  char *line_local;
  LineStream *this_local;
  
  for (local_1c = 0; local_1c < this->m_indent; local_1c = local_1c + 1) {
    std::operator<<(&(this->m_stream).super_basic_ostream<char,_std::char_traits<char>_>,"\t");
  }
  poVar1 = std::operator<<(&(this->m_stream).super_basic_ostream<char,_std::char_traits<char>_>,line
                          );
  std::operator<<(poVar1,"\n");
  return this;
}

Assistant:

LineStream&			operator<<		(const char* line)	{ for (int i = 0; i < m_indent; i++) { m_stream << "\t"; } m_stream << line << "\n"; return *this; }